

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_test.cc
# Opt level: O0

void __thiscall
fizplex::BaseTestRegularWithReordering::~BaseTestRegularWithReordering
          (BaseTestRegularWithReordering *this)

{
  Base *in_RDI;
  
  (in_RDI->etms).super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)&PTR__BaseTestRegularWithReordering_0026ba48;
  DVector::~DVector((DVector *)0x1c5e9d);
  DVector::~DVector((DVector *)0x1c5eae);
  DVector::~DVector((DVector *)0x1c5ebf);
  SVector::~SVector((SVector *)0x1c5ed0);
  SVector::~SVector((SVector *)0x1c5ee1);
  SVector::~SVector((SVector *)0x1c5eef);
  Base::~Base(in_RDI);
  ColMatrix::~ColMatrix((ColMatrix *)0x1c5f0b);
  testing::Test::~Test((Test *)in_RDI);
  return;
}

Assistant:

BaseTestRegularWithReordering() : b(m){}